

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_Touch(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  long *plVar1;
  PClass *pPVar2;
  long lVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  char *pcVar6;
  undefined8 *puVar7;
  bool bVar8;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      plVar1 = (long *)(param->field_0).field_1.a;
      if (plVar1 != (long *)0x0) {
        if (plVar1[1] == 0) {
          lVar3 = (**(code **)*plVar1)(plVar1);
          plVar1[1] = lVar3;
        }
        pPVar5 = (PClass *)plVar1[1];
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar2 && bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042dde9;
        }
      }
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          puVar7 = (undefined8 *)param[1].field_0.field_1.a;
          if (puVar7 == (undefined8 *)0x0) {
            NullParam("\"toucher\"");
            puVar7 = (undefined8 *)param[1].field_0.field_1.a;
          }
          pPVar2 = AActor::RegistrationInfo.MyClass;
          if (puVar7 != (undefined8 *)0x0) {
            if (puVar7[1] == 0) {
              uVar4 = (**(code **)*puVar7)(puVar7);
              puVar7[1] = uVar4;
            }
            pPVar5 = (PClass *)puVar7[1];
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar2 && bVar8) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar8 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar2) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar8) {
              pcVar6 = "toucher == NULL || toucher->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0042de08;
            }
          }
          (**(code **)(*plVar1 + 0x98))(plVar1,puVar7);
          return 0;
        }
        pcVar6 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_0042de08:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x5d4,"int AF_AActor_Touch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042dde9:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x5d3,"int AF_AActor_Touch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Touch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(toucher, AActor);
	self->Touch(toucher);
	return 0;
}